

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_get_utf8(archive *a,archive_mstring *aes,char **p)

{
  char *local_40;
  char *pm;
  archive_string_conv *paStack_30;
  wchar_t r;
  archive_string_conv *sc;
  char **p_local;
  archive_mstring *aes_local;
  archive *a_local;
  
  if ((aes->aes_set & 2U) == 0) {
    *p = (char *)0x0;
    sc = (archive_string_conv *)p;
    p_local = (char **)aes;
    aes_local = (archive_mstring *)a;
    if ((aes->aes_set & 1U) == 0) {
      archive_mstring_get_mbs(a,aes,&local_40);
    }
    if (((ulong)p_local[0xc] & 1) == 0) {
      a_local._4_4_ = L'\0';
    }
    else {
      paStack_30 = archive_string_conversion_to_charset((archive *)aes_local,"UTF-8",L'\x01');
      if (paStack_30 == (archive_string_conv *)0x0) {
        a_local._4_4_ = L'\xffffffff';
      }
      else {
        pm._4_4_ = archive_strncpy_l((archive_string *)(p_local + 3),*p_local,(size_t)p_local[1],
                                     paStack_30);
        if (aes_local == (archive_mstring *)0x0) {
          free_sconv_object(paStack_30);
        }
        if (pm._4_4_ == L'\0') {
          *(uint *)(p_local + 0xc) = *(uint *)(p_local + 0xc) | 2;
          sc->next = (archive_string_conv *)p_local[3];
          a_local._4_4_ = L'\0';
        }
        else {
          a_local._4_4_ = L'\xffffffff';
        }
      }
    }
  }
  else {
    *p = (aes->aes_utf8).s;
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

int
archive_mstring_get_utf8(struct archive *a, struct archive_mstring *aes,
  const char **p)
{
	struct archive_string_conv *sc;
	int r;

	/* If we already have a UTF8 form, return that immediately. */
	if (aes->aes_set & AES_SET_UTF8) {
		*p = aes->aes_utf8.s;
		return (0);
	}

	*p = NULL;
	/* Try converting WCS to MBS first if MBS does not exist yet. */
	if ((aes->aes_set & AES_SET_MBS) == 0) {
		const char *pm; /* unused */
		archive_mstring_get_mbs(a, aes, &pm); /* ignore errors, we'll handle it later */
	}
	if (aes->aes_set & AES_SET_MBS) {
		sc = archive_string_conversion_to_charset(a, "UTF-8", 1);
		if (sc == NULL)
			return (-1);/* Couldn't allocate memory for sc. */
		r = archive_strncpy_l(&(aes->aes_utf8), aes->aes_mbs.s,
		    aes->aes_mbs.length, sc);
		if (a == NULL)
			free_sconv_object(sc);
		if (r == 0) {
			aes->aes_set |= AES_SET_UTF8;
			*p = aes->aes_utf8.s;
			return (0);/* success. */
		} else
			return (-1);/* failure. */
	}
	return (0);/* success. */
}